

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::InitializeLoop(cmCTestMultiProcessHandler *this)

{
  uv_loop_ptr *this_00;
  cmCTest *this_01;
  uv_loop_t *puVar1;
  ostringstream cmCTestLog_msg;
  long *local_1f8;
  long local_1e8 [2];
  _Any_data local_1d8;
  code *local_1c8;
  undefined8 uStack_1c0;
  _Any_data local_1b0;
  code *local_1a0;
  code *local_198;
  _Storage<cmUVJobServerClient,_false> local_190;
  char local_188;
  ios_base local_120 [264];
  
  this_00 = &this->Loop;
  ::cm::uv_loop_ptr::init(this_00,(EVP_PKEY_CTX *)0x0);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  ::cm::uv_idle_ptr::init(&this->StartNextTestsOnIdle_,(EVP_PKEY_CTX *)puVar1);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  ::cm::uv_timer_ptr::init(&this->StartNextTestsOnTimer_,(EVP_PKEY_CTX *)puVar1);
  puVar1 = ::cm::uv_loop_ptr::operator*(this_00);
  local_1b0._8_8_ = 0;
  local_198 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx:178:30)>
              ::_M_invoke;
  local_1a0 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx:178:30)>
              ::_M_manager;
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c8 = (code *)0x0;
  uStack_1c0 = 0;
  local_1b0._M_unused._M_object = this;
  cmUVJobServerClient::Connect
            (&local_190._M_value,puVar1,(function<void_()> *)&local_1b0,
             (function<void_(int)> *)&local_1d8);
  std::_Optional_payload_base<cmUVJobServerClient>::_M_move_assign
            ((_Optional_payload_base<cmUVJobServerClient> *)&this->JobServerClient,
             (_Optional_payload_base<cmUVJobServerClient> *)&local_190._M_value);
  if (local_188 == '\x01') {
    local_188 = '\0';
    cmUVJobServerClient::~cmUVJobServerClient(&local_190._M_value);
  }
  if (local_1c8 != (code *)0x0) {
    (*local_1c8)(&local_1d8,&local_1d8,__destroy_functor);
  }
  if (local_1a0 != (code *)0x0) {
    (*local_1a0)(&local_1b0,&local_1b0,__destroy_functor);
  }
  if ((this->JobServerClient).super__Optional_base<cmUVJobServerClient,_false,_false>._M_payload.
      super__Optional_payload<cmUVJobServerClient,_true,_false,_false>.
      super__Optional_payload_base<cmUVJobServerClient>._M_engaged == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190._M_value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190._M_value,"Connected to MAKE jobserver",0x1b);
    std::ios::widen((char)&local_190 + (char)*(undefined8 *)(local_190.field2 + -0x18));
    std::ostream::put((char)&local_190);
    std::ostream::flush();
    this_01 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_01,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0xb6,(char *)local_1f8,false);
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190._M_value);
    std::ios_base::~ios_base(local_120);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::InitializeLoop()
{
  this->Loop.init();
  this->StartNextTestsOnIdle_.init(*this->Loop, this);
  this->StartNextTestsOnTimer_.init(*this->Loop, this);

  this->JobServerClient = cmUVJobServerClient::Connect(
    *this->Loop, /*onToken=*/[this]() { this->JobServerReceivedToken(); },
    /*onDisconnect=*/nullptr);
  if (this->JobServerClient) {
    cmCTestLog(this->CTest, OUTPUT,
               "Connected to MAKE jobserver" << std::endl);
  }
}